

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O2

int ldecode(lua_State *L)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  sproto_type *st;
  void *data;
  size_t sz;
  decode_ud self;
  
  st = (sproto_type *)lua_touserdata(L,1);
  if (st != (sproto_type *)0x0) {
    sz = 0;
    iVar3 = 2;
    data = getbuffer(L,2,&sz);
    iVar1 = lua_type(L,-1);
    if (iVar1 != 5) {
      lua_createtable(L,0,0);
    }
    luaL_checkstack(L,200,(char *)0x0);
    self.L = L;
    self.result_index = lua_gettop(L);
    self.array_index = 0;
    self.array_tag = (char *)0x0;
    self.deep = 0;
    self.mainindex_tag = -1;
    self.key_index = 0;
    uVar2 = sproto_decode(st,data,(int)sz,decode,&self);
    if ((int)uVar2 < 0) {
      iVar3 = luaL_error(L,"decode error");
    }
    else {
      lua_settop(L,self.result_index);
      lua_pushinteger(L,(ulong)uVar2);
    }
    return iVar3;
  }
  iVar1 = luaL_argerror(L,1,"Need a sproto_type object");
  return iVar1;
}

Assistant:

static int
ldecode(lua_State *L) {
	const int32_t * data = lua_touserdata(L,1);
	if (data == NULL) {
		return 0;
	}
	const uint8_t * b = (const uint8_t *)data;
	int32_t len = get_length(b);
	struct bson_reader br = { b , len };

	unpack_dict(L, &br, false);

	return 1;
}